

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O1

void gen_neon_widen(TCGContext_conflict1 *tcg_ctx,TCGv_i64 dest,TCGv_i32 src,int size,int u)

{
  TCGTemp *in_RAX;
  uintptr_t o;
  code *func;
  TCGTemp *args [1];
  TCGTemp *local_18;
  
  local_18 = in_RAX;
  if (u == 0) {
    if (size == 2) {
      tcg_gen_ext_i32_i64_aarch64(tcg_ctx,dest,src);
      goto LAB_00655daa;
    }
    if (size == 1) {
      func = helper_neon_widen_s16_aarch64;
    }
    else {
      if (size != 0) goto LAB_00655dd0;
      func = helper_neon_widen_s8_aarch64;
    }
  }
  else {
    if (size == 2) {
      tcg_gen_extu_i32_i64_aarch64(tcg_ctx,dest,src);
      goto LAB_00655daa;
    }
    if (size == 1) {
      func = helper_neon_widen_u16_aarch64;
    }
    else {
      if (size != 0) {
LAB_00655dd0:
        abort();
      }
      func = helper_neon_widen_u8_aarch64;
    }
  }
  local_18 = (TCGTemp *)(src + (long)&tcg_ctx->pool_cur);
  tcg_gen_callN_aarch64(tcg_ctx,func,(TCGTemp *)(dest + (long)tcg_ctx),1,&local_18);
LAB_00655daa:
  tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(src + (long)tcg_ctx));
  return;
}

Assistant:

static inline void gen_neon_widen(TCGContext *tcg_ctx, TCGv_i64 dest, TCGv_i32 src, int size, int u)
{
    if (u) {
        switch (size) {
        case 0: gen_helper_neon_widen_u8(tcg_ctx, dest, src); break;
        case 1: gen_helper_neon_widen_u16(tcg_ctx, dest, src); break;
        case 2: tcg_gen_extu_i32_i64(tcg_ctx, dest, src); break;
        default: abort();
        }
    } else {
        switch (size) {
        case 0: gen_helper_neon_widen_s8(tcg_ctx, dest, src); break;
        case 1: gen_helper_neon_widen_s16(tcg_ctx, dest, src); break;
        case 2: tcg_gen_ext_i32_i64(tcg_ctx, dest, src); break;
        default: abort();
        }
    }
    tcg_temp_free_i32(tcg_ctx, src);
}